

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Column *col)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_a8 [8];
  string line;
  iterator __end3;
  iterator __begin3;
  Column *__range3;
  bool first;
  Column *col_local;
  ostream *os_local;
  
  bVar1 = true;
  Column::begin((iterator *)&__end3.m_suffix,col);
  Column::end((iterator *)((long)&line.field_2 + 8),col);
  while( true ) {
    bVar2 = Column::iterator::operator!=
                      ((iterator *)&__end3.m_suffix,(iterator *)((long)&line.field_2 + 8));
    if (!bVar2) break;
    Column::iterator::operator*[abi_cxx11_((string *)local_a8,(iterator *)&__end3.m_suffix);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      ::std::operator<<(os,"\n");
    }
    ::std::operator<<(os,(string *)local_a8);
    ::std::__cxx11::string::~string((string *)local_a8);
    Column::iterator::operator++((iterator *)&__end3.m_suffix);
  }
  return os;
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Column const& col) {
		bool first = true;
		for (auto line : col) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}